

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O3

dxil_spv_result
dxil_spv_parsed_blob_get_entry_point_node_output
          (dxil_spv_parsed_blob blob,uint index,uint output_index,dxil_spv_node_output_data *data)

{
  pointer pEVar1;
  long lVar2;
  undefined8 uVar3;
  dxil_spv_result dVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)index;
  pEVar1 = (blob->entry_points).
           super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar4 = DXIL_SPV_ERROR_INVALID_ARGUMENT;
  if (uVar7 < (ulong)((long)(blob->entry_points).
                            super__Vector_base<dxil_spv_parsed_blob_s::EntryPoint,_dxil_spv::ThreadLocalAllocator<dxil_spv_parsed_blob_s::EntryPoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 8)) {
    uVar6 = (ulong)output_index;
    lVar2 = *(long *)&pEVar1[uVar7].node_outputs.
                      super__Vector_base<dxil_spv::NodeOutputData,_dxil_spv::ThreadLocalAllocator<dxil_spv::NodeOutputData>_>
                      ._M_impl;
    uVar7 = ((long)*(pointer *)
                    ((long)&pEVar1[uVar7].node_outputs.
                            super__Vector_base<dxil_spv::NodeOutputData,_dxil_spv::ThreadLocalAllocator<dxil_spv::NodeOutputData>_>
                            ._M_impl + 8) - lVar2 >> 3) * 0x6db6db6db6db6db7;
    if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
      lVar5 = uVar6 * 0x38;
      data->node_id = *(char **)(lVar2 + lVar5);
      uVar3 = *(undefined8 *)(lVar2 + 0x20 + lVar5);
      data->node_array_index = (int)uVar3;
      data->node_array_size = (int)((ulong)uVar3 >> 0x20);
      data->sparse_array = *(dxil_spv_bool *)(lVar2 + 0x30 + lVar5);
      uVar3 = *(undefined8 *)(lVar2 + 0x28 + lVar5);
      data->node_index_spec_constant_id = (int)uVar3;
      data->max_records = (int)((ulong)uVar3 >> 0x20);
      dVar4 = DXIL_SPV_SUCCESS;
    }
  }
  return dVar4;
}

Assistant:

dxil_spv_result dxil_spv_parsed_blob_get_entry_point_node_output(
    dxil_spv_parsed_blob blob, unsigned index, unsigned output_index, dxil_spv_node_output_data *data)
{
	if (index >= blob->entry_points.size())
		return DXIL_SPV_ERROR_INVALID_ARGUMENT;

	auto &entry = blob->entry_points[index];
	if (output_index >= entry.node_outputs.size())
		return DXIL_SPV_ERROR_INVALID_ARGUMENT;

	auto &output = entry.node_outputs[output_index];

	data->node_id = output.node_id.c_str();
	data->node_array_index = output.node_array_index;
	data->node_array_size = output.node_array_size;
	data->sparse_array = output.sparse_array;
	data->max_records = output.max_records;
	data->node_index_spec_constant_id = output.node_index_spec_constant_id;

	return DXIL_SPV_SUCCESS;
}